

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugPubTable::DWARFDebugPubTable
          (DWARFDebugPubTable *this,DWARFObject *Obj,DWARFSection *Sec,bool LittleEndian,
          bool GnuStyle)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  undefined7 in_register_00000081;
  undefined1 local_a8 [8];
  DWARFDataExtractor PubNames;
  StringRef local_70;
  undefined8 uStack_60;
  undefined8 local_58;
  DWARFSection *local_50;
  char *local_48;
  uint64_t Offset;
  undefined4 local_34;
  
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Sets).
  super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34 = (undefined4)CONCAT71(in_register_00000081,GnuStyle);
  this->GnuStyle = GnuStyle;
  local_a8 = (undefined1  [8])(Sec->Data).Data;
  PubNames.super_DataExtractor.Data.Data = (char *)(Sec->Data).Length;
  PubNames.super_DataExtractor.Data.Length._1_1_ = 0;
  local_48 = (char *)0x0;
  PubNames.super_DataExtractor.Data.Length._0_1_ = LittleEndian;
  PubNames.super_DataExtractor._16_8_ = Obj;
  PubNames.Obj = (DWARFObject *)Sec;
  local_50 = Sec;
  Offset = (uint64_t)this;
  while (uVar4 = Offset, local_48 < PubNames.super_DataExtractor.Data.Data) {
    PubNames.Section = (DWARFSection *)((ulong)PubNames.Section & 0xffff000000000000);
    local_70.Data = (char *)(local_70._4_8_ << 0x20);
    local_70.Length = 0;
    uStack_60 = 0;
    local_58 = 0;
    std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
    emplace_back<llvm::DWARFDebugPubTable::Set>
              ((vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
                *)Offset,(Set *)&PubNames.Section);
    std::
    _Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                     *)&local_70.Length);
    lVar1 = *(long *)(uVar4 + 8);
    uVar3 = DataExtractor::getU32((DataExtractor *)local_a8,(uint64_t *)&local_48,(Error *)0x0);
    *(uint32_t *)(lVar1 + -0x30) = uVar3;
    uVar2 = DataExtractor::getU16((DataExtractor *)local_a8,(uint64_t *)&local_48,(Error *)0x0);
    *(uint16_t *)(lVar1 + -0x2c) = uVar2;
    uVar4 = DWARFDataExtractor::getRelocatedValue
                      ((DWARFDataExtractor *)local_a8,4,(uint64_t *)&local_48,(uint64_t *)0x0,
                       (Error *)0x0);
    *(uint64_t *)(lVar1 + -0x28) = uVar4;
    uVar3 = DataExtractor::getU32((DataExtractor *)local_a8,(uint64_t *)&local_48,(Error *)0x0);
    *(uint32_t *)(lVar1 + -0x20) = uVar3;
    while ((local_48 < (char *)(local_50->Data).Length &&
           (uVar3 = DataExtractor::getU32
                              ((DataExtractor *)local_a8,(uint64_t *)&local_48,(Error *)0x0),
           uVar3 != 0))) {
      if ((char)local_34 != '\0') {
        DataExtractor::getU8((DataExtractor *)local_a8,(uint64_t *)&local_48,(Error *)0x0);
      }
      local_70 = DataExtractor::getCStrRef((DataExtractor *)local_a8,(uint64_t *)&local_48);
      PubNames.Section = (DWARFSection *)(ulong)uVar3;
      std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
      ::emplace_back<llvm::DWARFDebugPubTable::Entry>
                ((vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                  *)(lVar1 + -0x18),(Entry *)&PubNames.Section);
    }
  }
  return;
}

Assistant:

DWARFDebugPubTable::DWARFDebugPubTable(const DWARFObject &Obj,
                                       const DWARFSection &Sec,
                                       bool LittleEndian, bool GnuStyle)
    : GnuStyle(GnuStyle) {
  DWARFDataExtractor PubNames(Obj, Sec, LittleEndian, 0);
  uint64_t Offset = 0;
  while (PubNames.isValidOffset(Offset)) {
    Sets.push_back({});
    Set &SetData = Sets.back();

    SetData.Length = PubNames.getU32(&Offset);
    SetData.Version = PubNames.getU16(&Offset);
    SetData.Offset = PubNames.getRelocatedValue(4, &Offset);
    SetData.Size = PubNames.getU32(&Offset);

    while (Offset < Sec.Data.size()) {
      uint32_t DieRef = PubNames.getU32(&Offset);
      if (DieRef == 0)
        break;
      uint8_t IndexEntryValue = GnuStyle ? PubNames.getU8(&Offset) : 0;
      StringRef Name = PubNames.getCStrRef(&Offset);
      SetData.Entries.push_back(
          {DieRef, PubIndexEntryDescriptor(IndexEntryValue), Name});
    }
  }
}